

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O0

easy_pollset * mev_add_new_xfer_pollset(Curl_easy *data)

{
  CURLcode CVar1;
  easy_pollset *ps;
  Curl_easy *data_local;
  
  data_local = (Curl_easy *)(*Curl_ccalloc)(1,0x20);
  if (data_local == (Curl_easy *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    CVar1 = Curl_meta_set(data,"meta:mev:ps",data_local,mev_pollset_dtor);
    if (CVar1 != CURLE_OK) {
      data_local = (Curl_easy *)0x0;
    }
  }
  return (easy_pollset *)data_local;
}

Assistant:

static struct easy_pollset*
mev_add_new_xfer_pollset(struct Curl_easy *data)
{
  struct easy_pollset *ps;

  ps = calloc(1, sizeof(*ps));
  if(!ps)
    return NULL;
  if(Curl_meta_set(data, CURL_META_MEV_POLLSET, ps, mev_pollset_dtor))
    return NULL;
  return ps;
}